

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

TPZSkylMatrix<std::complex<long_double>_> * __thiscall
TPZSkylMatrix<std::complex<long_double>_>::operator-
          (TPZSkylMatrix<std::complex<long_double>_> *this,
          TPZSkylMatrix<std::complex<long_double>_> *A)

{
  int iVar1;
  undefined4 extraout_var;
  TPZSkylMatrix<std::complex<long_double>_> *pTVar2;
  int64_t iVar3;
  complex<long_double> *this_01;
  long *in_RDX;
  TPZSkylMatrix<std::complex<long_double>_> *in_RSI;
  TPZSkylMatrix<std::complex<long_double>_> *in_RDI;
  int i;
  int64_t size;
  TPZSkylMatrix<std::complex<long_double>_> *res;
  char *in_stack_00000188;
  char *in_stack_00000190;
  complex<long_double> *in_stack_ffffffffffffff88;
  int local_38;
  TPZSkylMatrix<std::complex<long_double>_> *this_00;
  
  iVar1 = (*(in_RSI->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.
            super_TPZSavable._vptr_TPZSavable[0xc])();
  this_00 = (TPZSkylMatrix<std::complex<long_double>_> *)CONCAT44(extraout_var,iVar1);
  pTVar2 = (TPZSkylMatrix<std::complex<long_double>_> *)(**(code **)(*in_RDX + 0x60))();
  if (this_00 != pTVar2) {
    TPZMatrix<std::complex<long_double>_>::Error(in_stack_00000190,in_stack_00000188);
  }
  (*(in_RSI->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable[0x4a])(in_RSI,in_RSI,in_RDX);
  TPZSkylMatrix(this_00,in_RSI);
  iVar3 = TPZVec<std::complex<long_double>_>::size(&in_RDI->fStorage);
  for (local_38 = 0; local_38 < iVar3; local_38 = local_38 + 1) {
    TPZVec<std::complex<long_double>_>::operator[]
              ((TPZVec<std::complex<long_double>_> *)(in_RDX + 8),(long)local_38);
    this_01 = TPZVec<std::complex<long_double>_>::operator[](&in_RDI->fStorage,(long)local_38);
    std::complex<long_double>::operator-=(this_01,in_stack_ffffffffffffff88);
  }
  return in_RDI;
}

Assistant:

TPZSkylMatrix<TVar>
TPZSkylMatrix<TVar>::operator-(const TPZSkylMatrix<TVar> &A ) const
{
  if ( this->Dim() != A.Dim() )
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"<incompatible dimensions>" );
  CheckTypeCompatibility(this,&A);
	auto res(*this);
  const auto size = res.fStorage.size();
  for(auto i = 0; i < size; i++) res.fStorage[i] -= A.fStorage[i];
	return res;
}